

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O1

VmValue * CompileVmVariableAccess(ExpressionContext *ctx,VmModule *module,ExprVariableAccess *node)

{
  VariableData *source;
  TypeBase *type;
  Allocator *pAVar1;
  SynIdentifier *pSVar2;
  char *pcVar3;
  int iVar4;
  undefined4 extraout_var;
  VariableData *variable;
  VmValue *pVVar5;
  TypeBase *in_RCX;
  uint in_R9D;
  
  source = node->variable;
  type = (TypeBase *)((InplaceStr *)&source->type)->begin;
  if ((type == (TypeBase *)0x0) || (type->typeID != 1)) {
    variable = (VariableData *)ExpressionContext::GetReferenceType(ctx,type);
    pVVar5 = anon_unknown.dwarf_233176::CreateVariableAddress
                       (module,(SynBase *)source,variable,in_RCX);
    pVVar5 = anon_unknown.dwarf_233176::CreateLoad
                       (ctx,module,(node->super_ExprBase).source,node->variable->type,pVVar5,in_R9D)
    ;
    pSVar2 = node->variable->name;
    pcVar3 = (pSVar2->name).end;
    (pVVar5->comment).begin = (pSVar2->name).begin;
    (pVVar5->comment).end = pcVar3;
  }
  else {
    iVar4 = (*module->allocator->_vptr_Allocator[2])(module->allocator,0x98);
    pVVar5 = (VmValue *)CONCAT44(extraout_var,iVar4);
    pAVar1 = module->allocator;
    pVVar5->typeID = 0;
    pVVar5->source = (SynBase *)0x0;
    (pVVar5->comment).begin = (char *)0x0;
    (pVVar5->type).type = VM_TYPE_VOID;
    (pVVar5->type).size = 0;
    (pVVar5->type).structType = (TypeBase *)0x0;
    (pVVar5->comment).end = (char *)0x0;
    (pVVar5->users).allocator = pAVar1;
    (pVVar5->users).data = (pVVar5->users).little;
    (pVVar5->users).count = 0;
    (pVVar5->users).max = 8;
    pVVar5->hasSideEffects = false;
    pVVar5->hasMemoryAccess = false;
    pVVar5->canBeRemoved = true;
    pVVar5->hasKnownSimpleUse = false;
    pVVar5->hasKnownNonSimpleUse = false;
    pVVar5->_vptr_VmValue = (_func_int **)&PTR__VmValue_003f8c60;
  }
  anon_unknown.dwarf_233176::CheckType(ctx,&node->super_ExprBase,pVVar5);
  return pVVar5;
}

Assistant:

VmValue* CompileVmVariableAccess(ExpressionContext &ctx, VmModule *module, ExprVariableAccess *node)
{
	if(isType<TypeVoid>(node->variable->type))
		return CheckType(ctx, node, CreateVoid(module));

	VmValue *address = CreateVariableAddress(module, node->source, node->variable, ctx.GetReferenceType(node->variable->type));

	VmValue *value = CreateLoad(ctx, module, node->source, node->variable->type, address, 0);

	value->comment = node->variable->name->name;

	return CheckType(ctx, node, value);
}